

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqliteArchive.cpp
# Opt level: O1

void __thiscall
gtar::SqliteArchive::writePtr
          (SqliteArchive *this,string *path,void *contents,size_t byteLength,CompressMode mode,
          bool immediate)

{
  int iVar1;
  char *pcVar2;
  runtime_error *prVar3;
  ostream *poVar4;
  size_t iValue;
  ulong uVar5;
  ulong uVar6;
  undefined3 in_register_00000089;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rawSizes;
  vector<const_char_*,_std::allocator<const_char_*>_> rawTargets;
  vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> compressedBytes;
  stringstream result;
  int local_26c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  ulong local_248;
  size_t local_240;
  void *local_238;
  void *pvStack_230;
  long local_228;
  string *local_218;
  void *local_210;
  size_t local_208;
  undefined4 local_200;
  int local_1fc;
  vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> local_1f8;
  string local_1d8 [32];
  SharedArray<char> local_1b8 [2];
  ostream local_1a8 [376];
  
  local_200 = CONCAT31(in_register_00000089,immediate);
  local_218 = path;
  local_210 = contents;
  if (this->m_mode == Read) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Can\'t write to an archive opened for reading");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238 = (void *)0x0;
  pvStack_230 = (void *)0x0;
  local_228 = 0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1f8.super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240 = byteLength;
  if (mode - FastCompress < 2) {
    local_26c = 1;
    if (byteLength != 0) {
      uVar5 = 1000000000;
      uVar7 = 0;
      iValue = 0;
      do {
        uVar6 = byteLength - uVar7;
        if (499999999 < uVar6) {
          uVar6 = 500000000;
        }
        local_248 = uVar5;
        local_208 = iValue;
        local_1fc = LZ4_compressBound((int)uVar6);
        uVar5 = (ulong)local_1fc;
        pcVar2 = (char *)operator_new__(uVar5);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)operator_new(0x18);
        (local_1b8[0].m_shim)->m_target = pcVar2;
        (local_1b8[0].m_shim)->m_length = uVar5;
        (local_1b8[0].m_shim)->m_count = 1;
        std::vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>>::
        emplace_back<gtar::SharedArray<char>>
                  ((vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>> *)
                   &local_1f8,local_1b8);
        SharedArray<char>::release(local_1b8);
        byteLength = local_240;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          local_1b8[0].m_shim = (SharedArrayShim<char> *)0x0;
        }
        else {
          local_1b8[0].m_shim =
               (SharedArrayShim<char> *)
               (local_1f8.
                super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_238,(char **)local_1b8)
        ;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = (local_1f8.
                    super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        iVar1 = LZ4_compress_default((char *)(uVar7 + (long)local_210),pcVar2,(int)uVar6,local_1fc);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)(long)iVar1;
        if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
        }
        else {
          *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_1b8[0].m_shim;
          local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iValue = local_208 +
                 local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish[-1];
        uVar7 = local_248 >> 1;
        uVar5 = local_248 + 1000000000;
      } while (uVar7 < byteLength);
      goto LAB_0010fbb8;
    }
  }
  else {
    if (mode != SlowCompress) {
      if (byteLength != 0) {
        uVar5 = 1000000000;
        uVar7 = 0;
        do {
          local_1b8[0].m_shim = (SharedArrayShim<char> *)((long)local_210 + uVar7);
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_238,
                     (char **)local_1b8);
          local_1b8[0].m_shim = (SharedArrayShim<char> *)(local_240 - uVar7);
          if ((SharedArrayShim<char> *)0x1dcd64ff < local_1b8[0].m_shim) {
            local_1b8[0].m_shim = (SharedArrayShim<char> *)0x1dcd6500;
          }
          if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_268,
                       (iterator)
                       local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
          }
          else {
            *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_1b8[0].m_shim;
            local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          uVar7 = uVar5 >> 1;
          uVar5 = uVar5 + 1000000000;
        } while (uVar7 < local_240);
      }
      local_26c = 0;
      iValue = local_240;
      byteLength = local_240;
      goto LAB_0010fbb8;
    }
    local_26c = 1;
    if (byteLength != 0) {
      uVar5 = 1000000000;
      uVar7 = 0;
      iValue = 0;
      do {
        uVar6 = byteLength - uVar7;
        if (499999999 < uVar6) {
          uVar6 = 500000000;
        }
        local_248 = uVar5;
        local_208 = iValue;
        iVar1 = LZ4_compressBound((int)uVar6);
        pcVar2 = (char *)operator_new__((long)iVar1);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)operator_new(0x18);
        (local_1b8[0].m_shim)->m_target = pcVar2;
        (local_1b8[0].m_shim)->m_length = (long)iVar1;
        (local_1b8[0].m_shim)->m_count = 1;
        std::vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>>::
        emplace_back<gtar::SharedArray<char>>
                  ((vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>> *)
                   &local_1f8,local_1b8);
        SharedArray<char>::release(local_1b8);
        byteLength = local_240;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          local_1b8[0].m_shim = (SharedArrayShim<char> *)0x0;
        }
        else {
          local_1b8[0].m_shim =
               (SharedArrayShim<char> *)
               (local_1f8.
                super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_238,(char **)local_1b8)
        ;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = (local_1f8.
                    super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        iVar1 = LZ4_compress_HC((char *)(uVar7 + (long)local_210),pcVar2,(int)uVar6,iVar1,0xb);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)(long)iVar1;
        if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
        }
        else {
          *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_1b8[0].m_shim;
          local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iValue = local_208 +
                 local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish[-1];
        uVar7 = local_248 >> 1;
        uVar5 = local_248 + 1000000000;
      } while (uVar7 < byteLength);
      goto LAB_0010fbb8;
    }
  }
  local_26c = 1;
  iValue = 0;
LAB_0010fbb8:
  sqlite3_bind_text(this->m_insert_filename_stmt,1,(local_218->_M_dataplus)._M_p,
                    (int)local_218->_M_string_length,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int64(this->m_insert_filename_stmt,2,byteLength);
  sqlite3_bind_int64(this->m_insert_filename_stmt,3,iValue);
  sqlite3_bind_int(this->m_insert_filename_stmt,4,local_26c);
  sqlite3_bind_text(this->m_insert_contents_stmt,1,(local_218->_M_dataplus)._M_p,
                    (int)local_218->_M_string_length,(_func_void_void_ptr *)0x0);
  if ((char)local_200 == '\0') {
    do {
      iVar1 = sqlite3_step(this->m_insert_filename_stmt);
    } while (iVar1 == 5);
    if (pvStack_230 != local_238) {
      uVar5 = 0;
      do {
        sqlite3_bind_blob(this->m_insert_contents_stmt,2,*(void **)((long)local_238 + uVar5 * 8),
                          (int)local_268.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar5],
                          (_func_void_void_ptr *)0x0);
        sqlite3_bind_int64(this->m_insert_contents_stmt,3,uVar5);
        do {
          iVar1 = sqlite3_step(this->m_insert_contents_stmt);
        } while (iVar1 == 5);
        sqlite3_reset(this->m_insert_contents_stmt);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)pvStack_230 - (long)local_238 >> 3));
    }
  }
  else {
    iVar1 = 5;
    while (iVar1 == 5) {
      sqlite3_step(this->m_begin_stmt);
      sqlite3_step(this->m_insert_filename_stmt);
      if (pvStack_230 != local_238) {
        uVar5 = 0;
        do {
          sqlite3_bind_blob(this->m_insert_contents_stmt,2,*(void **)((long)local_238 + uVar5 * 8),
                            (int)local_268.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar5],
                            (_func_void_void_ptr *)0x0);
          sqlite3_bind_int64(this->m_insert_contents_stmt,3,uVar5);
          iVar1 = sqlite3_step(this->m_insert_contents_stmt);
          if (iVar1 != 0x65) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Couldn\'t insert chunk in sqlite database: ",0x2a);
            pcVar2 = sqlite3_errstr(iVar1);
            std::operator<<(local_1a8,pcVar2);
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,local_1d8);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sqlite3_reset(this->m_insert_contents_stmt);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)pvStack_230 - (long)local_238 >> 3));
      }
      iVar1 = sqlite3_step(this->m_end_stmt);
    }
  }
  sqlite3_clear_bindings(this->m_insert_filename_stmt);
  sqlite3_clear_bindings(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_begin_stmt);
  sqlite3_reset(this->m_insert_filename_stmt);
  sqlite3_reset(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_end_stmt);
  if (iVar1 != 0x65) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Error inserting record at ",0x1a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(local_218->_M_dataplus)._M_p,local_218->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    pcVar2 = sqlite3_errmsg(this->m_connection);
    std::operator<<(local_1a8,pcVar2);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1d8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_fileNames,local_218);
  std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::~vector
            (&local_1f8);
  if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238 != (void *)0x0) {
    operator_delete(local_238,local_228 - (long)local_238);
  }
  return;
}

Assistant:

void SqliteArchive::writePtr(const string &path, const void *contents,
                                 const size_t byteLength, CompressMode mode,
                                 bool immediate)
    {
        if(m_mode == Read)
            throw runtime_error("Can't write to an archive opened for reading");

        vector<const char*> rawTargets;
        vector<size_t> rawSizes;
        size_t compressedSize(0);
        unsigned int rawCompression(0);
        vector<SharedArray<char> > compressedBytes;

        if(mode == FastCompress || mode == MediumCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_default(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else if(mode == SlowCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_HC(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize, LZ4HC_CLEVEL_OPT_MIN));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else
        {
            for(size_t chunkidx(0); chunkidx*RAW_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) RAW_CHUNK_SIZE, byteLength - chunkidx*RAW_CHUNK_SIZE));
                rawTargets.push_back(((const char*) contents) + chunkidx*RAW_CHUNK_SIZE);
                rawSizes.push_back(sourceSize);
            }
            compressedSize = byteLength;
        }

        sqlite3_bind_text(m_insert_filename_stmt, 1, path.c_str(), path.size(), 0);
        sqlite3_bind_int64(m_insert_filename_stmt, 2, byteLength);
        sqlite3_bind_int64(m_insert_filename_stmt, 3, compressedSize);
        sqlite3_bind_int(m_insert_filename_stmt, 4, rawCompression);

        sqlite3_bind_text(m_insert_contents_stmt, 1, path.c_str(), path.size(), 0);

        int status(SQLITE_BUSY);

        if(immediate)
        {
            while(status == SQLITE_BUSY)
            {
                status = sqlite3_step(m_begin_stmt);

                status = sqlite3_step(m_insert_filename_stmt);

                for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
                {
                    sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                        rawSizes[chunkidx], 0);
                    sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                    status = sqlite3_step(m_insert_contents_stmt);

                    if(status != SQLITE_DONE)
                    {
                        stringstream result;
                        result << "Couldn't insert chunk in sqlite database: ";
                        result << sqlite3_errstr(status);
                        throw runtime_error(result.str());
                    }

                    sqlite3_reset(m_insert_contents_stmt);
                }

                status = sqlite3_step(m_end_stmt);
            }
        }
        else
        {
            do {status = sqlite3_step(m_insert_filename_stmt);} while(status == SQLITE_BUSY);

            for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
            {
                sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                    rawSizes[chunkidx], 0);
                sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                do {status = sqlite3_step(m_insert_contents_stmt);} while(status == SQLITE_BUSY);
                sqlite3_reset(m_insert_contents_stmt);
            }
        }

        sqlite3_clear_bindings(m_insert_filename_stmt);
        sqlite3_clear_bindings(m_insert_contents_stmt);
        sqlite3_reset(m_begin_stmt);
        sqlite3_reset(m_insert_filename_stmt);
        sqlite3_reset(m_insert_contents_stmt);
        sqlite3_reset(m_end_stmt);

        if(status != SQLITE_DONE)
        {
            stringstream result;
            result << "Error inserting record at " << path << ": ";
            result << sqlite3_errmsg(m_connection);
            throw runtime_error(result.str());
        }

        m_fileNames.push_back(path);
    }